

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O0

void __thiscall Diagnostics::validateNetwork(Diagnostics *this,Network *nw)

{
  bool bVar1;
  int iVar2;
  NetworkError *pNVar3;
  InputError *this_00;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  Network *pNStack_18;
  bool result;
  Network *nw_local;
  Diagnostics *this_local;
  
  local_19 = 1;
  pNStack_18 = nw;
  nw_local = (Network *)this;
  iVar2 = Network::count(nw,NODE);
  if (iVar2 < 2) {
    local_55 = 1;
    pNVar3 = (NetworkError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    NetworkError::NetworkError(pNVar3,1,(string *)local_40);
    local_55 = 0;
    __cxa_throw(pNVar3,&NetworkError::typeinfo,NetworkError::~NetworkError);
  }
  bVar1 = hasFixedGradeNodes(pNStack_18);
  if (!bVar1) {
    local_7a = 1;
    pNVar3 = (NetworkError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"",&local_79);
    NetworkError::NetworkError(pNVar3,2,(string *)local_78);
    local_7a = 0;
    __cxa_throw(pNVar3,&NetworkError::typeinfo,NetworkError::~NetworkError);
  }
  bVar1 = hasValidNodes(pNStack_18);
  if (!bVar1) {
    local_19 = 0;
  }
  bVar1 = hasValidLinks(pNStack_18);
  if (!bVar1) {
    local_19 = 0;
  }
  bVar1 = hasValidValves(pNStack_18);
  if (!bVar1) {
    local_19 = 0;
  }
  bVar1 = hasValidCurves(pNStack_18);
  if (!bVar1) {
    local_19 = 0;
  }
  bVar1 = hasConnectedNodes(pNStack_18);
  if (!bVar1) {
    local_19 = 0;
  }
  if ((local_19 & 1) == 0) {
    this_00 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"",&local_a1);
    InputError::InputError(this_00,0,(string *)local_a0);
    __cxa_throw(this_00,&InputError::typeinfo,InputError::~InputError);
  }
  return;
}

Assistant:

void Diagnostics::validateNetwork(Network* nw)
{
    bool result = true;
    if ( nw->count(Element::NODE) < 2 )
    {
        throw NetworkError(NetworkError::TOO_FEW_NODES, "");
    }
    if ( !hasFixedGradeNodes(nw) )
    {
         throw NetworkError(NetworkError::NO_FIXED_GRADE_NODES, "");
    }
    if ( !hasValidNodes(nw) )      result = false;
    if ( !hasValidLinks(nw) )      result = false;
    if ( !hasValidValves(nw) )     result = false;
    if ( !hasValidCurves(nw) )     result = false;
    if ( !hasConnectedNodes(nw) )  result = false;
    if ( result == false )
    {
        throw InputError(InputError::ERRORS_IN_INPUT_DATA, "");
    }
}